

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestBrokenInclude::Run(ParserTestBrokenInclude *this)

{
  VirtualFileSystem *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  string err;
  ManifestParser parser;
  string local_c0;
  string local_a0;
  undefined1 local_80 [96];
  
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"include.ninja","");
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"build\n","");
  this_00 = &(this->super_ParserTest).fs_;
  VirtualFileSystem::Create(this_00,(string *)local_80,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  ManifestParser::ManifestParser
            ((ManifestParser *)local_80,&(this->super_ParserTest).state,(FileReader *)this_00,
             (ManifestParserOptions)0x0);
  pTVar2 = g_current_test;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"include include.ninja\n","");
  bVar3 = ManifestParser::ParseTest((ManifestParser *)local_80,&local_a0,&local_c0);
  testing::Test::Check
            (pTVar2,!bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3af,"parser.ParseTest(\"include include.ninja\\n\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_c0);
  testing::Test::Check
            (pTVar2,iVar4 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3b3,"\"include.ninja:1: expected path\\n\" \"build\\n\" \"     ^ near here\" == err"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(ParserTest, BrokenInclude) {
  fs_.Create("include.ninja", "build\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("include include.ninja\n", &err));
  EXPECT_EQ("include.ninja:1: expected path\n"
            "build\n"
            "     ^ near here"
            , err);
}